

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void smult(double *A,double *B,double *C,int m,int n,int p)

{
  int n_00;
  int p_00;
  double *Y;
  long lVar1;
  long lVar2;
  ulong uVar3;
  int zcol;
  long lVar4;
  double *pdVar5;
  int local_74;
  int local_70;
  int a;
  int b;
  int c;
  double *local_60;
  double *local_58;
  double *local_50;
  size_t local_48;
  double *local_40;
  uint local_38;
  uint local_34;
  
  local_40 = (double *)CONCAT44(local_40._4_4_,n);
  local_74 = m;
  local_70 = n;
  a = p;
  _b = B;
  local_60 = A;
  local_38 = m;
  local_34 = p;
  findrec(&local_74,&local_70,&a);
  n_00 = local_70;
  local_48 = (size_t)local_74;
  lVar4 = local_48 * 8;
  lVar2 = (long)local_70;
  Y = (double *)malloc(lVar4 * lVar2);
  p_00 = a;
  lVar1 = (long)a;
  local_58 = (double *)malloc(lVar2 * lVar1 * 8);
  local_50 = (double *)malloc(lVar4 * lVar1);
  zcol = n_00 - (int)local_40;
  add_zero_pad(local_60,local_38,(int)local_40,(int)local_48 - local_38,zcol,Y);
  pdVar5 = local_58;
  add_zero_pad(_b,(int)local_40,local_34,zcol,p_00 - local_34,local_58);
  local_40 = Y;
  srecmult(Y,pdVar5,local_50,(int)local_48,n_00,p_00,n_00,p_00,p_00);
  if (0 < (int)local_38) {
    lVar2 = (long)(int)local_34;
    uVar3 = (ulong)local_38;
    local_48 = (ulong)local_34 << 3;
    pdVar5 = local_50;
    do {
      if (0 < (int)local_34) {
        memcpy(C,pdVar5,local_48);
      }
      pdVar5 = pdVar5 + lVar1;
      C = C + lVar2;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  free(local_40);
  free(local_58);
  free(local_50);
  return;
}

Assistant:

void smult(double* A, double* B, double* C,int m,int n, int p) {
	int a,b,c,nrec;
	double *X,*Y,*Z,*P;
	a = m;
	b = n;
	c = p;
	nrec = findrec(&a,&b,&c);
	X = (double*) malloc(sizeof(double) * a * b);
	Y = (double*) malloc(sizeof(double) * b * c);
	Z = (double*) malloc(sizeof(double) * a * c);
	P = (double*) malloc(sizeof(double) * (a/2) * (c/2));

	
	add_zero_pad(A,m,n,a-m,b-n,X);
	add_zero_pad(B,n,p,b-n,c-p,Y);

	srecmult(X,Y,Z,a,b,c,b,c,c);
	// Memory allocation needs work
	
	remove_zero_pad(Z,a,c,a-m,c-p,C);
	
	// free X,Y,Z
	free(X);
	free(Y);
	free(Z);
	free(P);
	
}